

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tb.cc
# Opt level: O0

void __thiscall
kratos::AssertPropertyStmt::AssertPropertyStmt
          (AssertPropertyStmt *this,shared_ptr<kratos::Property> *property)

{
  element_type *peVar1;
  shared_ptr<kratos::Property> *property_local;
  AssertPropertyStmt *this_local;
  
  AssertBase::AssertBase(&this->super_AssertBase);
  (this->super_AssertBase).super_Stmt.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005993f8
  ;
  peVar1 = std::__shared_ptr<kratos::Property,_(__gnu_cxx::_Lock_policy)2>::get
                     (&property->super___shared_ptr<kratos::Property,_(__gnu_cxx::_Lock_policy)2>);
  this->property_ = peVar1;
  std::shared_ptr<kratos::Stmt>::shared_ptr(&this->else_stmt_,(nullptr_t)0x0);
  return;
}

Assistant:

AssertPropertyStmt::AssertPropertyStmt(const std::shared_ptr<Property> &property)
    : property_(property.get()) {}